

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O2

Vec_Wec_t * Json_Read(char *pFileName,Abc_Nam_t **ppStrs)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pIn;
  byte *__s;
  size_t sVar4;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Abc_Nam_t *p_00;
  ulong uVar7;
  Vec_Int_t *pVVar8;
  byte *pbVar9;
  byte *pLim;
  byte *pbVar10;
  byte *pbVar11;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    p = (Vec_Wec_t *)0x0;
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
  }
  else {
    iVar2 = Extra_FileSize(pFileName);
    pIn = (char *)malloc((long)(iVar2 + 1));
    fread(pIn,(long)iVar2,1,__stream);
    pIn[iVar2] = '\0';
    fclose(__stream);
    __s = (byte *)Json_ReadPreprocess(pIn,iVar2);
    sVar4 = strlen((char *)__s);
    free(pIn);
    p = (Vec_Wec_t *)malloc(0x10);
    p->nCap = 1000;
    p->nSize = 0;
    pVVar5 = (Vec_Int_t *)calloc(1000,0x10);
    p->pArray = pVVar5;
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    p_00 = Abc_NamStart(1000,0x18);
    pbVar11 = __s;
    while (pbVar10 = pbVar11, pbVar11 < __s + (int)sVar4) {
      while( true ) {
        bVar1 = *pbVar10;
        uVar7 = (ulong)bVar1;
        pbVar11 = pbVar10;
        if (0x3a < uVar7) break;
        if ((0x400000100002600U >> (uVar7 & 0x3f) & 1) == 0) {
          if (uVar7 == 0) goto LAB_002d6da8;
          break;
        }
        pbVar10 = pbVar10 + 1;
      }
      while ((0x3a < (byte)uVar7 || ((0x400000100002600U >> (uVar7 & 0x3f) & 1) == 0))) {
        uVar7 = (ulong)pbVar11[1];
        pbVar11 = pbVar11 + 1;
      }
      if ((bVar1 == 0x2c) || (bVar1 == 0x3a)) {
LAB_002d6c6a:
        pbVar11 = pbVar10 + 1;
      }
      else if (bVar1 == 0x5b) {
LAB_002d6c0d:
        if (pVVar5->nSize < 1) {
          iVar2 = p->nSize;
        }
        else {
          iVar2 = Vec_IntEntryLast(pVVar5);
          pVVar8 = Vec_WecEntry(p,iVar2);
          iVar2 = p->nSize;
          iVar3 = Abc_Var2Lit(iVar2,0);
          Vec_IntPush(pVVar8,iVar3);
        }
        Vec_IntPush(pVVar5,iVar2);
        if (iVar2 == p->nCap) {
          uVar7 = (ulong)(uint)(iVar2 * 2);
          if (iVar2 < 0x10) {
            uVar7 = 0x10;
          }
          iVar3 = (int)uVar7;
          if (iVar3 - iVar2 != 0 && iVar2 <= iVar3) {
            if (p->pArray == (Vec_Int_t *)0x0) {
              pVVar8 = (Vec_Int_t *)malloc(uVar7 << 4);
            }
            else {
              pVVar8 = (Vec_Int_t *)realloc(p->pArray,uVar7 << 4);
            }
            p->pArray = pVVar8;
            memset(pVVar8 + iVar2,0,(long)(iVar3 - iVar2) << 4);
            p->nCap = iVar3;
          }
        }
        p->nSize = iVar2 + 1U;
        if (iVar2 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        pVVar8 = p->pArray;
        Vec_IntGrow(pVVar8 + ((ulong)(iVar2 + 1U) - 1),4);
        Vec_IntPush(pVVar8 + ((ulong)(iVar2 + 1U) - 1),(uint)(*pbVar10 == 0x5b));
        pbVar11 = pbVar10 + 1;
      }
      else {
        if ((bVar1 == 0x5d) || (bVar1 == 0x7d)) {
          if (pVVar5->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
          }
          pVVar5->nSize = pVVar5->nSize + -1;
          goto LAB_002d6c6a;
        }
        if (bVar1 == 0x7b) goto LAB_002d6c0d;
        pbVar9 = pbVar11 + -1;
        if (pbVar11[-1] != 0x2c) {
          pbVar9 = pbVar11;
        }
        pLim = pbVar9 + -1;
        if (pbVar9[-1] != 0x22) {
          pLim = pbVar9;
        }
        iVar2 = Abc_NamStrFindOrAddLim
                          (p_00,(char *)(pbVar10 + (bVar1 == 0x22)),(char *)pLim,(int *)0x0);
        iVar3 = Vec_IntEntryLast(pVVar5);
        pVVar8 = Vec_WecEntry(p,iVar3);
        iVar2 = Abc_Var2Lit(iVar2,1);
        Vec_IntPush(pVVar8,iVar2);
      }
    }
LAB_002d6da8:
    free(pVVar5->pArray);
    free(pVVar5);
    free(__s);
    *ppStrs = p_00;
  }
  return p;
}

Assistant:

Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs )
{
    Abc_Nam_t * pStrs; 
    Vec_Wec_t * vObjs; 
    Vec_Int_t * vStack, * vTemp;
    char * pContents, * pCur, * pNext, * pCur2, * pNext2;
    int nFileSize, RetValue, iToken;
    FILE * pFile;

    // read the file into the buffer
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    nFileSize = Extra_FileSize( pFileName );
    pContents = pCur = ABC_ALLOC( char, nFileSize+1 );
    RetValue = fread( pContents, nFileSize, 1, pFile );
    pContents[nFileSize] = 0;
    fclose( pFile );

    pContents = Json_ReadPreprocess( pCur = pContents, nFileSize );
    nFileSize = strlen(pContents);
    ABC_FREE( pCur );
    pCur = pContents;

    // start data-structures
    vObjs  = Vec_WecAlloc( 1000 );
    vStack = Vec_IntAlloc( 100 );
    pStrs  = Abc_NamStart( 1000, 24 );
    //Json_AddTypes( pStrs );

    // read lines
    assert( Vec_WecSize(vObjs) == 0 );
    assert( Vec_IntSize(vStack) == 0 );
    while ( pCur < pContents + nFileSize )
    {
        pCur  = Json_SkipSpaces( pCur );
        if ( *pCur == '\0' )
            break;
        pNext = Json_SkipNonSpaces( pCur );
        if ( *pCur == '{' || *pCur == '[' )
        {
            // add fanin to node on the previous level
            if ( Vec_IntSize(vStack) > 0 )
                Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(Vec_WecSize(vObjs), 0) );            
            // add node to the stack
            Vec_IntPush( vStack, Vec_WecSize(vObjs) );
            vTemp = Vec_WecPushLevel( vObjs );
            Vec_IntGrow( vTemp, 4 );
            // remember it as an array
            Vec_IntPush( vTemp, (int)(*pCur == '[') );
            pCur++;
            continue;
        }
        if ( *pCur == '}' || *pCur == ']' )
        {
            Vec_IntPop( vStack );
            pCur++;
            continue;
        }
        if ( *pCur == ',' || *pCur == ':' )
        {
            pCur++;
            continue;
        }
        iToken = Json_TokenCompare( pCur, pNext, &pCur2, &pNext2 );
        if ( iToken == 0 )
            iToken = Abc_NamStrFindOrAddLim( pStrs, pCur2, pNext2, NULL );
        Vec_IntPush( Vec_WecEntry(vObjs, Vec_IntEntryLast(vStack)), Abc_Var2Lit(iToken, 1) );
        pCur = pNext;
    }
    Vec_IntFree( vStack );
    ABC_FREE( pContents );
    *ppStrs = pStrs;
    return vObjs;
}